

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_faceForward_vec4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float res;
  float fVar2;
  float local_48 [4];
  float local_38 [4];
  float local_28 [4];
  Vector<float,_4> res_1;
  
  res_1.m_data._0_8_ = *(undefined8 *)(c->in[0].m_data + 1);
  local_28[2] = c->in[0].m_data[3];
  local_28[3] = c->in[0].m_data[0];
  local_28[0] = res_1.m_data[0];
  local_28[1] = res_1.m_data[1];
  local_38[0] = c->in[1].m_data[3];
  local_38[1] = c->in[1].m_data[2];
  local_38[2] = c->in[1].m_data[1];
  local_38[3] = c->in[1].m_data[0];
  local_48[0] = c->in[2].m_data[0];
  local_48[1] = c->in[2].m_data[3];
  local_48[2] = c->in[2].m_data[2];
  local_48[3] = c->in[2].m_data[1];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_48[lVar1] * local_38[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  if (0.0 <= fVar2) {
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_1.m_data[lVar1] = -local_28[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else {
    res_1.m_data[3] = local_28[3];
    res_1.m_data[2] = local_28[2];
  }
  *(undefined8 *)(c->color).m_data = res_1.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_1.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }